

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O2

void tnt_buf_free(tnt_stream *s)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)s->data;
  if ((*(int *)(puVar1 + 7) == 0) && ((void *)*puVar1 != (void *)0x0)) {
    tnt_mem_free((void *)*puVar1);
  }
  if ((code *)puVar1[5] != (code *)0x0) {
    (*(code *)puVar1[5])(s);
  }
  tnt_mem_free(s->data);
  s->data = (void *)0x0;
  return;
}

Assistant:

static void tnt_buf_free(struct tnt_stream *s) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (!sb->as && sb->data)
		tnt_mem_free(sb->data);
	if (sb->free)
		sb->free(s);
	tnt_mem_free(s->data);
	s->data = NULL;
}